

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

void __thiscall
pbrt::ParallelForLoop2D::ParallelForLoop2D
          (ParallelForLoop2D *this,Bounds2i *extent,int chunkSize,
          function<void_(pbrt::Bounds2<int>)> *func)

{
  function<void_(pbrt::Bounds2<int>)> *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  ParallelJob *in_RDI;
  function<void_(pbrt::Bounds2<int>)> *in_stack_ffffffffffffffc8;
  
  ParallelJob::ParallelJob(in_RDI);
  in_RDI->_vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop2D_03749598;
  std::function<void_(pbrt::Bounds2<int>)>::function(in_RCX,in_stack_ffffffffffffffc8);
  in_RDI[2]._vptr_ParallelJob = (_func_int **)*in_RSI;
  in_RDI[2].prev = (ParallelJob *)in_RSI[1];
  in_RDI[2].next = (ParallelJob *)*in_RSI;
  in_RDI[2].activeWorkers = in_EDX;
  return;
}

Assistant:

ParallelForLoop2D(const Bounds2i &extent, int chunkSize,
                      std::function<void(Bounds2i)> func)
        : func(std::move(func)),
          extent(extent),
          nextStart(extent.pMin),
          chunkSize(chunkSize) {}